

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  undefined8 uVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  cmValue cVar7;
  cmCTestGenericHandler *pcVar8;
  cmake *gname;
  ostream *poVar9;
  string *psVar10;
  char *pcVar11;
  char *pcVar12;
  string *option;
  pointer pbVar13;
  allocator<char> local_261;
  undefined1 local_260 [16];
  string local_250;
  string local_230;
  _Base_ptr local_210;
  cmList options;
  string local_1e8;
  string cmakelists_file;
  string cmakeConfigureCommand;
  
  options.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->Options)._M_string_length != 0) {
    cmList::assign(&options,&this->Options,Yes,No);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"BuildDirectory",(allocator<char> *)&cmakelists_file);
  cmCTest::GetCTestConfiguration(&cmakeConfigureCommand,pcVar1,&local_230);
  std::__cxx11::string::~string((string *)&cmakeConfigureCommand);
  std::__cxx11::string::~string((string *)&local_230);
  if (cmakeConfigureCommand._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmakeConfigureCommand,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,(allocator<char> *)&local_230);
    cmCommand::SetError((cmCommand *)this,&cmakeConfigureCommand);
LAB_0027fe9c:
    psVar10 = &cmakeConfigureCommand;
LAB_0027fea4:
    std::__cxx11::string::~string((string *)psVar10);
  }
  else {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmakeConfigureCommand,"CTEST_CONFIGURE_COMMAND",
               (allocator<char> *)&local_230);
    cVar7 = cmMakefile::GetDefinition(pcVar2,&cmakeConfigureCommand);
    std::__cxx11::string::~string((string *)&cmakeConfigureCommand);
    if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 cVar7.Value,(this->super_cmCTestHandlerCommand).Quiet);
LAB_0027fc98:
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmakeConfigureCommand,"CTEST_LABELS_FOR_SUBPROJECTS",
                 (allocator<char> *)&local_230);
      cVar7 = cmMakefile::GetDefinition(pcVar2,&cmakeConfigureCommand);
      std::__cxx11::string::~string((string *)&cmakeConfigureCommand);
      if (cVar7.Value != (string *)0x0) {
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                   "LabelsForSubprojects",cVar7.Value,(this->super_cmCTestHandlerCommand).Quiet);
      }
      pcVar8 = &cmCTest::GetConfigureHandler
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest)->
                super_cmCTestGenericHandler;
      (*((cmCTestGenericHandler *)&pcVar8->_vptr_cmCTestGenericHandler)->_vptr_cmCTestGenericHandler
        [3])(pcVar8);
      pcVar8->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
      goto LAB_0027feac;
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmakeConfigureCommand,"CTEST_CMAKE_GENERATOR",
               (allocator<char> *)&local_230);
    cVar7 = cmMakefile::GetDefinition(pcVar2,&cmakeConfigureCommand);
    std::__cxx11::string::~string((string *)&cmakeConfigureCommand);
    if ((cVar7.Value == (string *)0x0) || ((cVar7.Value)->_M_string_length == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmakeConfigureCommand,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,(allocator<char> *)&local_230);
      cmCommand::SetError((cmCommand *)this,&cmakeConfigureCommand);
      goto LAB_0027fe9c;
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_210 = (_Base_ptr)cVar7;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmakeConfigureCommand,"SourceDirectory",
               (allocator<char> *)&cmakelists_file);
    cmCTest::GetCTestConfiguration(&local_230,pcVar1,&cmakeConfigureCommand);
    std::__cxx11::string::~string((string *)&cmakeConfigureCommand);
    if (local_230._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmakeConfigureCommand,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,(allocator<char> *)&cmakelists_file);
      cmCommand::SetError((cmCommand *)this,&cmakeConfigureCommand);
      std::__cxx11::string::~string((string *)&cmakeConfigureCommand);
      psVar10 = &local_230;
      goto LAB_0027fea4;
    }
    std::operator+(&cmakelists_file,&local_230,"/CMakeLists.txt");
    bVar5 = cmsys::SystemTools::FileExists(&cmakelists_file);
    if (bVar5) {
      gname = cmMakefile::GetCMakeInstance
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                         Makefile);
      cmake::CreateGlobalGenerator((cmake *)local_260,(string *)gname,SUB81(local_210,0));
      if ((pointer)local_260._0_8_ == (pointer)0x0) {
        local_260._12_4_ = 0;
      }
      else {
        local_260._12_4_ =
             (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                          *)local_260._0_8_)->
                       super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                       )._M_t.
                       super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                       .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[0x28].
                       _vptr_cmGlobalGeneratorFactory)();
        uVar3 = local_260._0_8_;
        local_260._0_8_ = (pointer)0x0;
        if ((pointer)uVar3 != (pointer)0x0) {
          (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                       *)uVar3)->
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                    _vptr_cmGlobalGeneratorFactory)();
        }
      }
      local_250._M_dataplus._M_p._0_1_ = 0x22;
      psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_1e8._M_dataplus._M_p._0_1_ = '\"';
      cmStrCat<char,std::__cxx11::string_const&,char>
                (&cmakeConfigureCommand,local_260 + 0x10,psVar10,(char *)&local_1e8);
      pbVar4 = options.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar6 = false;
      for (pbVar13 = options.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar4;
          pbVar13 = pbVar13 + 1) {
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
        std::__cxx11::string::append((string *)&cmakeConfigureCommand);
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
        pcVar12 = (pbVar13->_M_dataplus)._M_p;
        pcVar11 = strstr(pcVar12,"CMAKE_BUILD_TYPE=");
        if ((pcVar11 != (char *)0x0) ||
           (pcVar12 = strstr(pcVar12,"CMAKE_BUILD_TYPE:STRING="), pcVar12 != (char *)0x0)) {
          bVar6 = true;
        }
      }
      if (((local_260._12_4_ & 1) == 0 && !bVar6) &&
         (psVar10 = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest),
         psVar10->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
        cmCTest::GetConfigType_abi_cxx11_
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
        std::__cxx11::string::append((string *)&cmakeConfigureCommand);
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      }
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_260 + 0x10),"CTEST_USE_LAUNCHERS",(allocator<char> *)&local_1e8);
      bVar6 = cmMakefile::IsOn(pcVar2,(string *)(local_260 + 0x10));
      std::__cxx11::string::~string((string *)(local_260 + 0x10));
      if (bVar6) {
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      }
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      std::__cxx11::string::append((string *)&cmakeConfigureCommand);
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_260 + 0x10),"CTEST_CMAKE_GENERATOR_PLATFORM",
                 (allocator<char> *)&local_1e8);
      cVar7 = cmMakefile::GetDefinition(pcVar2,(string *)(local_260 + 0x10));
      std::__cxx11::string::~string((string *)(local_260 + 0x10));
      if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
        std::__cxx11::string::append((string *)&cmakeConfigureCommand);
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      }
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_260 + 0x10),"CTEST_CMAKE_GENERATOR_TOOLSET",
                 (allocator<char> *)&local_1e8);
      cVar7 = cmMakefile::GetDefinition(pcVar2,(string *)(local_260 + 0x10));
      std::__cxx11::string::~string((string *)(local_260 + 0x10));
      if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
        std::__cxx11::string::append((string *)&cmakeConfigureCommand);
        std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      }
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      std::__cxx11::string::append((string *)&cmakeConfigureCommand);
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"BuildDirectory",&local_261);
      cmCTest::GetCTestConfiguration((string *)(local_260 + 0x10),pcVar1,&local_1e8);
      std::__cxx11::string::append((string *)&cmakeConfigureCommand);
      std::__cxx11::string::~string((string *)(local_260 + 0x10));
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::append((char *)&cmakeConfigureCommand);
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 &cmakeConfigureCommand,(this->super_cmCTestHandlerCommand).Quiet);
      std::__cxx11::string::~string((string *)&cmakeConfigureCommand);
      if ((pointer)local_260._0_8_ != (pointer)0x0) {
        (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                     *)local_260._0_8_)->
                  super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                  )._M_t.
                  super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                  .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                  _vptr_cmGlobalGeneratorFactory)();
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmakeConfigureCommand);
      poVar9 = std::operator<<((ostream *)&cmakeConfigureCommand,
                               "CMakeLists.txt file does not exist [");
      poVar9 = std::operator<<(poVar9,(string *)&cmakelists_file);
      std::operator<<(poVar9,"]");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,(string *)(local_260 + 0x10));
      std::__cxx11::string::~string((string *)(local_260 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmakeConfigureCommand);
    }
    std::__cxx11::string::~string((string *)&cmakelists_file);
    std::__cxx11::string::~string((string *)&local_230);
    if (bVar5) goto LAB_0027fc98;
  }
  pcVar8 = (cmCTestGenericHandler *)0x0;
LAB_0027feac:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&options.Values);
  return pcVar8;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  cmList options;

  if (!this->Options.empty()) {
    options.assign(this->Options);
  }

  if (this->CTest->GetCTestConfiguration("BuildDirectory").empty()) {
    this->SetError(
      "Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return nullptr;
  }

  cmValue ctestConfigureCommand =
    this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if (cmNonempty(ctestConfigureCommand)) {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
                                       *ctestConfigureCommand, this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if (cmNonempty(cmakeGeneratorName)) {
      const std::string& source_dir =
        this->CTest->GetCTestConfiguration("SourceDirectory");
      if (source_dir.empty()) {
        this->SetError(
          "Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return nullptr;
      }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if (!cmSystemTools::FileExists(cmakelists_file)) {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist [" << cmakelists_file << "]";
        this->SetError(e.str());
        return nullptr;
      }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      auto gg = this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
        *cmakeGeneratorName);
      if (gg) {
        multiConfig = gg->IsMultiConfig();
        gg.reset();
      }

      std::string cmakeConfigureCommand =
        cmStrCat('"', cmSystemTools::GetCMakeCommand(), '"');

      for (std::string const& option : options) {
        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
            (nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING="))) {
          cmakeBuildTypeInOptions = true;
        }
      }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty()) {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
      }

      if (this->Makefile->IsOn("CTEST_USE_LAUNCHERS")) {
        cmakeConfigureCommand += " \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"";
      }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += *cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      cmValue cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if (cmNonempty(cmakeGeneratorPlatform)) {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += *cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
      }

      cmValue cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if (cmNonempty(cmakeGeneratorToolset)) {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += *cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
      }

      cmakeConfigureCommand += " \"-S";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      cmakeConfigureCommand += " \"-B";
      cmakeConfigureCommand +=
        this->CTest->GetCTestConfiguration("BuildDirectory");
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration("ConfigureCommand",
                                         cmakeConfigureCommand, this->Quiet);
    } else {
      this->SetError(
        "Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return nullptr;
    }
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  cmCTestConfigureHandler* handler = this->CTest->GetConfigureHandler();
  handler->Initialize();
  handler->SetQuiet(this->Quiet);
  return handler;
}